

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

uint32_t __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::append_to_codepoint
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,uint32_t cp,int c,error_code *ec)

{
  bool bVar1;
  uint32_t uVar2;
  
  uVar2 = cp * 0x10;
  if (c - 0x30U < 10) {
    uVar2 = uVar2 | c - 0x30U;
  }
  else if (c - 0x61U < 6) {
    uVar2 = (uVar2 + c) - 0x57;
  }
  else if (c - 0x41U < 6) {
    uVar2 = (uVar2 + c) - 0x37;
  }
  else {
    bVar1 = std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
                      (&this->err_handler_,invalid_unicode_escape_sequence,&this->super_ser_context)
    ;
    this->more_ = bVar1;
    if (!bVar1) {
      std::error_code::operator=(ec,invalid_unicode_escape_sequence);
    }
  }
  return uVar2;
}

Assistant:

uint32_t append_to_codepoint(uint32_t cp, int c, std::error_code& ec)
    {
        cp *= 16;
        if (c >= '0'  &&  c <= '9')
        {
            cp += c - '0';
        }
        else if (c >= 'a'  &&  c <= 'f')
        {
            cp += c - 'a' + 10;
        }
        else if (c >= 'A'  &&  c <= 'F')
        {
            cp += c - 'A' + 10;
        }
        else
        {
            more_ = err_handler_(json_errc::invalid_unicode_escape_sequence, *this);
            if (!more_)
            {
                ec = json_errc::invalid_unicode_escape_sequence;
                return cp;
            }
        }
        return cp;
    }